

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDataStack.h
# Opt level: O0

void __thiscall
HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
          (HighsDataStack *this,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *r)

{
  long lVar1;
  long *plVar2;
  Nonzero *__dest;
  char *pcVar3;
  vector<char,_std::allocator<char>_> *in_RDI;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *unaff_retaddr;
  size_t numData;
  vector<char,_std::allocator<char>_> *__new_size;
  
  *(long *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl =
       *(long *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl + -8;
  __new_size = in_RDI;
  plVar2 = (long *)std::vector<char,_std::allocator<char>_>::operator[]
                             (in_RDI,*(size_type *)
                                      &in_RDI[1].super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl);
  lVar1 = *plVar2;
  if (lVar1 == 0) {
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             *)0x4c5197);
  }
  else {
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ::resize(unaff_retaddr,(size_type)__new_size);
    *(long *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl =
         *(long *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl + lVar1 * -0x10
    ;
    __dest = std::
             vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             ::data((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                     *)0x4c51cb);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x4c51d9);
    memcpy(__dest,pcVar3 + *(long *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl,lVar1 << 4);
  }
  return;
}

Assistant:

void pop(std::vector<T>& r) {
    // pop the vector size
    position -= sizeof(std::size_t);
    std::size_t numData;
    std::memcpy(&numData, &data[position], sizeof(std::size_t));
    // pop the data
    if (numData == 0) {
      r.clear();
    } else {
      r.resize(numData);
      position -= numData * sizeof(T);
      std::memcpy(r.data(), data.data() + position, numData * sizeof(T));
    }
  }